

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_file.cc
# Opt level: O3

bool google::protobuf::compiler::java::anon_unknown_0::CollectExtensions
               (Message *message,FieldDescriptorSet *extensions)

{
  int iVar1;
  undefined4 extraout_var;
  long *plVar3;
  bool bVar4;
  _Alloc_node __an;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  long *plVar2;
  
  iVar1 = (*(message->super_MessageLite)._vptr_MessageLite[0x16])();
  plVar2 = (long *)CONCAT44(extraout_var,iVar1);
  plVar3 = (long *)(**(code **)(*plVar2 + 0x10))(plVar2,message);
  plVar3 = (long *)*plVar3;
  if ((plVar3 == (long *)0x0) || ((int)((ulong)(plVar3[1] - *plVar3) >> 4) < 1)) {
    (**(code **)(*plVar2 + 0x80))(plVar2,message);
    bVar4 = true;
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool CollectExtensions(const Message& message,
                       FieldDescriptorSet* extensions) {
  const Reflection* reflection = message.GetReflection();

  // There are unknown fields that could be extensions, thus this call fails.
  if (reflection->GetUnknownFields(message).field_count() > 0) return false;

  std::vector<const FieldDescriptor*> fields;
  reflection->ListFields(message, &fields);

  for (int i = 0; i < fields.size(); i++) {
    if (fields[i]->is_extension()) extensions->insert(fields[i]);

    if (GetJavaType(fields[i]) == JAVATYPE_MESSAGE) {
      if (fields[i]->is_repeated()) {
        int size = reflection->FieldSize(message, fields[i]);
        for (int j = 0; j < size; j++) {
          const Message& sub_message =
            reflection->GetRepeatedMessage(message, fields[i], j);
          if (!CollectExtensions(sub_message, extensions)) return false;
        }
      } else {
        const Message& sub_message = reflection->GetMessage(message, fields[i]);
        if (!CollectExtensions(sub_message, extensions)) return false;
      }
    }
  }

  return true;
}